

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

void __thiscall
moira::StrWriter::briefExtension<(moira::Mode)6,(moira::Size)2>
          (StrWriter *this,Ea<(moira::Mode)6,_(moira::Size)2> *ea)

{
  bool bVar1;
  char *pcVar2;
  byte *pbVar3;
  u16 uVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  
  uVar5 = ea->ext1;
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = '(';
  if ((char)uVar5 != '\0') {
    operator<<(this,(Int)(int)(char)uVar5);
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = ',';
  }
  uVar4 = ea->reg;
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = 'A';
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = (char)uVar4 + '0';
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = ',';
  uVar7 = uVar5 >> 0xc & 0xf;
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = (uVar7 < 8) * '\x03' + 'A';
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = (uVar7 < 8) * '\b' + (char)uVar7 + '(';
  bVar1 = this->upper;
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = '.';
  pbVar3 = (byte *)this->ptr;
  this->ptr = (char *)(pbVar3 + 1);
  bVar6 = 0x4c;
  if ((uVar5 >> 0xb & 1) == 0) {
    bVar6 = 0x57;
  }
  *pbVar3 = bVar6 | (bVar1 ^ 1U) << 5;
  uVar5 = uVar5 >> 9 & 3;
  if (uVar5 != 0) {
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = '*';
    pbVar3 = (byte *)this->ptr;
    this->ptr = (char *)(pbVar3 + 1);
    *pbVar3 = (byte)(1 << (sbyte)uVar5) | 0x30;
  }
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = ')';
  return;
}

Assistant:

void
StrWriter::briefExtension(const Ea<M,S> &ea)
{
    assert(M == 6 || M == 10);

    //   15 - 12    11   10   09   08   07   06   05   04   03   02   01   00
    // -----------------------------------------------------------------------
    // | REGISTER | LW | SCALE   | 0  | DISPLACEMENT                         |
    // -----------------------------------------------------------------------

    u16 reg   = xxxx____________ (ea.ext1);
    u16 lw    = ____x___________ (ea.ext1);
    u16 scale = _____xx_________ (ea.ext1);
    u16 disp  = ________xxxxxxxx (ea.ext1);

    *this << "(";
    if (disp) *this << Int{(i8)disp} << ",";
    M == 10 ? *this << "PC" : *this << An{ea.reg};
    *this << "," << Rn{reg};
    lw ? *this << Sz<Long>{} : *this << Sz<Word>{};
    *this << Scale{scale} << ")";
}